

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O3

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddBranch(InstructionBuilder *this,uint32_t label_id)

{
  IRContext *c;
  Instruction *pIVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined4 local_78 [2];
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  local_a0._24_8_ = local_a0 + 0x10;
  local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._8_8_ = 1;
  local_78[0] = 1;
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  local_70._8_8_ = 0;
  local_70._24_8_ = local_70 + 0x10;
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._16_4_ = label_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_a0);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_78,&local_48);
  Instruction::Instruction(pIVar1,c,OpBranch,0,0,(OperandList *)&local_48);
  local_a8._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  local_70._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_50,local_50._M_head_impl);
  }
  local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
  if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_a8);
  if (local_a8._M_head_impl != (Instruction *)0x0) {
    (*((local_a8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddBranch(uint32_t label_id) {
    std::unique_ptr<Instruction> new_branch(new Instruction(
        GetContext(), spv::Op::OpBranch, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {label_id}}}));
    return AddInstruction(std::move(new_branch));
  }